

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O0

idx_t duckdb::RefineNestedLoopJoin::Operation<signed_char,duckdb::LessThanEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  bool bVar1;
  idx_t idx;
  idx_t idx_00;
  SelectionVector *this;
  SelectionVector *in_stack_00000008;
  bool right_is_valid;
  SelectionVector *in_stack_00000010;
  bool left_is_valid;
  idx_t right_idx;
  idx_t left_idx;
  idx_t ridx;
  idx_t lidx;
  idx_t i;
  idx_t result_count;
  char *rdata;
  char *ldata;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  char *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  UnifiedVectorFormat *in_stack_fffffffffffffef0;
  ulong local_f0;
  UnifiedVectorFormat *local_e8;
  UnifiedVectorFormat local_c0;
  SelectionVector *local_78;
  UnifiedVectorFormat *in_stack_ffffffffffffffa0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffef0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffb0,(idx_t)in_stack_ffffffffffffffa8._M_pi,
             in_stack_ffffffffffffffa0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffb0,(idx_t)in_stack_ffffffffffffffa8._M_pi,
             in_stack_ffffffffffffffa0);
  UnifiedVectorFormat::GetData<signed_char>((UnifiedVectorFormat *)&local_78);
  UnifiedVectorFormat::GetData<signed_char>(&local_c0);
  local_e8 = (UnifiedVectorFormat *)0x0;
  for (local_f0 = 0; local_f0 < right_idx; local_f0 = local_f0 + 1) {
    idx = SelectionVector::get_index(in_stack_00000008,local_f0);
    idx_00 = SelectionVector::get_index(in_stack_00000010,local_f0);
    SelectionVector::get_index(local_78,idx);
    this = (SelectionVector *)SelectionVector::get_index(local_c0.sel,idx_00);
    in_stack_fffffffffffffeed =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   ((TemplatedValidityMask<unsigned_long> *)
                    CONCAT17(in_stack_fffffffffffffeef,
                             CONCAT16(in_stack_fffffffffffffeee,
                                      CONCAT15(in_stack_fffffffffffffeed,
                                               CONCAT14(in_stack_fffffffffffffeec,
                                                        in_stack_fffffffffffffee8)))),
                    (idx_t)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffeef = in_stack_fffffffffffffeed;
    in_stack_fffffffffffffeec =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   ((TemplatedValidityMask<unsigned_long> *)
                    CONCAT17(in_stack_fffffffffffffeed,
                             CONCAT16(in_stack_fffffffffffffeee,
                                      CONCAT15(in_stack_fffffffffffffeed,
                                               CONCAT14(in_stack_fffffffffffffeec,
                                                        in_stack_fffffffffffffee8)))),
                    (idx_t)in_stack_fffffffffffffee0);
    in_stack_fffffffffffffeee = in_stack_fffffffffffffeec;
    bVar1 = ComparisonOperationWrapper<duckdb::LessThanEquals>::Operation<signed_char>
                      ((char *)CONCAT17(in_stack_fffffffffffffeef,
                                        CONCAT16(in_stack_fffffffffffffeec,
                                                 CONCAT15(in_stack_fffffffffffffeed,
                                                          CONCAT14(in_stack_fffffffffffffeec,
                                                                   in_stack_fffffffffffffee8)))),
                       in_stack_fffffffffffffee0,(bool)in_stack_fffffffffffffedf,
                       (bool)in_stack_fffffffffffffede);
    in_stack_fffffffffffffee8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee8);
    if (bVar1) {
      SelectionVector::set_index
                (this,CONCAT17(in_stack_fffffffffffffeef,
                               CONCAT16(in_stack_fffffffffffffeee,
                                        CONCAT15(in_stack_fffffffffffffeed,
                                                 CONCAT14(in_stack_fffffffffffffeec,
                                                          in_stack_fffffffffffffee8)))),
                 (idx_t)in_stack_fffffffffffffee0);
      SelectionVector::set_index
                (this,CONCAT17(in_stack_fffffffffffffeef,
                               CONCAT16(in_stack_fffffffffffffeee,
                                        CONCAT15(in_stack_fffffffffffffeed,
                                                 CONCAT14(in_stack_fffffffffffffeec,
                                                          in_stack_fffffffffffffee8)))),
                 (idx_t)in_stack_fffffffffffffee0);
      local_e8 = (UnifiedVectorFormat *)((long)&local_e8->sel + 1);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(local_e8);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_e8);
  return (idx_t)local_e8;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		// refine phase of the nested loop join
		// refine lvector and rvector based on matches of subsequent conditions (in case there are multiple conditions
		// in the join)
		D_ASSERT(current_match_count > 0);
		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (idx_t i = 0; i < current_match_count; i++) {
			auto lidx = lvector.get_index(i);
			auto ridx = rvector.get_index(i);
			auto left_idx = left_data.sel->get_index(lidx);
			auto right_idx = right_data.sel->get_index(ridx);
			bool left_is_valid = left_data.validity.RowIsValid(left_idx);
			bool right_is_valid = right_data.validity.RowIsValid(right_idx);
			if (MATCH_OP::Operation(ldata[left_idx], rdata[right_idx], !left_is_valid, !right_is_valid)) {
				lvector.set_index(result_count, lidx);
				rvector.set_index(result_count, ridx);
				result_count++;
			}
		}
		return result_count;
	}